

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentalsAppearance.cpp
# Opt level: O3

KString * __thiscall
KDIS::DATA_TYPE::EnvironmentalsAppearance::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EnvironmentalsAppearance *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Environmental Appearance:",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tDensity:        ",0x12);
  ENUMS::GetEnumAsStringEntityDensity_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)(*(ushort *)&this->field_0x2 & 0xf),Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tFrozen Status:  ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tState:          ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tMasked/Cloaked: ",0x12);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString EnvironmentalsAppearance::GetAsString() const
{
    KStringStream ss;

    ss << "Environmental Appearance:"
       << "\n\tDensity:        " << GetEnumAsStringEntityDensity( m_Density )
	   << "\n\tFrozen Status:  " << m_FrozenStatus
	   << "\n\tState:          " << m_State
	   << "\n\tMasked/Cloaked: " << m_MaskedCloaked
       << "\n";

    return ss.str();
}